

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O3

void __thiscall Args::HelpPrinter::print(HelpPrinter *this,OutStreamType *to)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  CmdLine *pCVar1;
  bool bVar2;
  long lVar3;
  undefined8 uVar4;
  __normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
  _Var5;
  __normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
  _Var6;
  undefined8 *puVar7;
  _Head_base<4UL,_unsigned_long,_false> _Var8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  value_type *pvVar12;
  _Any_data *this_00;
  undefined8 *puVar13;
  uint uVar14;
  undefined8 uVar15;
  anon_class_16_2_51562d2c __f;
  bool requiredFlag;
  size_type maxLineLength;
  bool makeOffset_2;
  size_type length;
  StringList usage;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> optional;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> required;
  bool makeOffset;
  StringList usage_1;
  vector<Args::Command_*,_std::allocator<Args::Command_*>_> commands;
  size_type maxCommand;
  size_type maxName;
  size_type maxFlag;
  undefined1 local_291;
  ulong local_290;
  ulong local_288;
  long local_280;
  OutStreamType local_271;
  ulong local_270;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  __normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
  local_248;
  __normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
  _Stack_240;
  long local_238;
  __normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
  local_228;
  __normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
  _Stack_220;
  long local_218;
  bool local_210 [8];
  undefined1 local_208 [8];
  HelpPrinter *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Head_base<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_false>
  local_1e8;
  _Head_base<5UL,_std::reference_wrapper<unsigned_long>,_false> local_1e0;
  _Head_base<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_false>
  local_1d8;
  _Head_base<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_false>
  local_1d0;
  _Any_data local_1b8;
  undefined8 local_1a8;
  undefined8 *local_198;
  undefined8 *puStack_190;
  long local_188;
  long local_178;
  long local_170;
  _Head_base<4UL,_unsigned_long,_false> local_168;
  _Any_data local_160;
  code *local_150;
  _Any_data local_140;
  code *local_130;
  _Any_data local_120;
  code *local_110;
  _Any_data local_100;
  code *local_f0;
  _Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long))(Args::ArgIface_*,_std::basic_ostream<char,_std::char_traits<char>_>_&,_unsigned_long,_unsigned_long)_const>
  local_e0;
  _Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long))(Args::ArgIface_*,_std::basic_ostream<char,_std::char_traits<char>_>_&,_unsigned_long,_unsigned_long)_const>
  local_b0;
  _Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool))(const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_&,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_bool)_const>
  local_80;
  
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Head_base<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_false>
  ._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       &local_228;
  local_228._M_current = (ArgIface **)0x0;
  _Stack_220._M_current = (ArgIface **)0x0;
  local_218 = 0;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Head_base<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_false>
  ._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       &local_248;
  local_238 = 0;
  local_248._M_current = (ArgIface **)0x0;
  _Stack_240._M_current = (ArgIface **)0x0;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Head_base<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_false>
  ._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>)
       &local_198;
  local_188 = 0;
  local_198 = (undefined8 *)0x0;
  puStack_190 = (undefined8 *)0x0;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Head_base<5UL,_std::reference_wrapper<unsigned_long>,_false>._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)&local_168;
  local_168._M_head_impl = 0;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Head_base<6UL,_std::reference_wrapper<unsigned_long>,_false>._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)&local_170;
  local_170 = 0;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Tuple_impl<7UL,_std::reference_wrapper<unsigned_long>,_bool>.
  super__Head_base<7UL,_std::reference_wrapper<unsigned_long>,_false>._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)&local_178;
  local_178 = 0;
  local_80._M_f = (offset_in_HelpPrinter_to_subr)sortArg;
  local_80._8_8_ = 0;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Tuple_impl<7UL,_std::reference_wrapper<unsigned_long>,_bool>.super__Tuple_impl<8UL,_bool>.
  super__Head_base<8UL,_bool,_false>._M_head_impl = (_Head_base<8UL,_bool,_false>)false;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Head_base<0UL,_Args::HelpPrinter_*,_false>._M_head_impl = this;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,std::_Bind<void(Args::HelpPrinter::*(Args::HelpPrinter*,std::_Placeholder<1>,std::reference_wrapper<std::vector<Args::Command*,std::allocator<Args::Command*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,bool))(std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const&,std::vector<Args::Command*,std::allocator<Args::Command*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,unsigned_long&,unsigned_long&,unsigned_long&,bool)const>>
            ((_Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool))(const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_&,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_bool)_const>
              *)local_208,
             (this->m_cmdLine->m_args).
             super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_cmdLine->m_args).
             super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,&local_80);
  _Var6._M_current = _Stack_220._M_current;
  _Var5._M_current = local_228._M_current;
  if (local_228._M_current != _Stack_220._M_current) {
    uVar10 = (long)_Stack_220._M_current - (long)local_228._M_current >> 3;
    lVar3 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Args::ArgIface**,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Args::HelpPrinter::print(std::ostream&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_228._M_current,_Stack_220._M_current,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Args::ArgIface**,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Args::HelpPrinter::print(std::ostream&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (_Var5._M_current,_Var6._M_current);
  }
  _Var6._M_current = _Stack_240._M_current;
  _Var5._M_current = local_248._M_current;
  if (local_248._M_current != _Stack_240._M_current) {
    uVar10 = (long)_Stack_240._M_current - (long)local_248._M_current >> 3;
    lVar3 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Args::ArgIface**,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Args::HelpPrinter::print(std::ostream&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (local_248._M_current,_Stack_240._M_current,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Args::ArgIface**,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Args::HelpPrinter::print(std::ostream&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (_Var5._M_current,_Var6._M_current);
  }
  puVar13 = puStack_190;
  puVar7 = local_198;
  if (local_198 != puStack_190) {
    uVar10 = (long)puStack_190 - (long)local_198 >> 3;
    lVar3 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Args::Command**,std::vector<Args::Command*,std::allocator<Args::Command*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Args::HelpPrinter::print(std::ostream&)::_lambda(auto:1_const&,auto:2_const&)_3_>>
              (local_198,puStack_190,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Args::Command**,std::vector<Args::Command*,std::allocator<Args::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Args::HelpPrinter::print(std::ostream&)::_lambda(auto:1_const&,auto:2_const&)_3_>>
              (puVar7,puVar13);
  }
  local_168._M_head_impl = local_168._M_head_impl + 2;
  local_170 = local_170 + 2;
  local_178 = local_178 + 2;
  local_200 = (HelpPrinter *)0x0;
  local_1f8._M_allocated_capacity = local_1f8._M_allocated_capacity & 0xffffffffffffff00;
  local_268._M_unused._M_object = (String *)0x0;
  local_268._8_8_ = (String *)0x0;
  local_258 = (code *)0x0;
  __first._M_current = (this->m_appDescription)._M_dataplus._M_p;
  __f.result = (StringList *)&local_268;
  __f.word = (String *)local_208;
  local_208 = (undefined1  [8])&local_1f8;
  std::
  for_each<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,Args::HelpPrinter::splitToWords(std::__cxx11::string_const&)const::_lambda(char_const&)_1_>
            (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(__first._M_current + (this->m_appDescription)._M_string_length),__f);
  if (local_200 != (HelpPrinter *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_268,(value_type *)local_208);
  }
  if (local_208 != (undefined1  [8])&local_1f8) {
    operator_delete((void *)local_208,local_1f8._M_allocated_capacity + 1);
  }
  local_1b8._M_unused._M_object = (void *)0x0;
  local_280 = 0;
  local_288 = 0;
  uVar10 = this->m_lineLength;
  local_290 = uVar10;
  if (uVar10 < 0x14) {
    std::__ostream_insert<char,std::char_traits<char>>(to,"\n\n",2);
    local_290 = this->m_lineLength - 0x14;
    local_280 = 0x14;
  }
  uVar4 = local_268._8_8_;
  local_1b8._M_unused._M_object = (void *)0x0;
  local_288 = 0;
  local_1e8._M_head_impl._M_data =
       (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>)&local_270;
  local_208 = (undefined1  [8])local_210;
  local_210[0] = uVar10 < 0x14;
  local_270 = 0;
  local_1f8._8_8_ = &local_280;
  local_1e0._M_head_impl._M_data = (reference_wrapper<unsigned_long>)&local_290;
  local_1d0._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       &local_288;
  local_200 = (HelpPrinter *)to;
  local_1f8._M_allocated_capacity = (size_type)&local_1b8;
  local_1d8._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)this;
  if (local_268._M_unused._M_object != (void *)local_268._8_8_) {
    uVar15 = local_268._M_unused._0_8_;
    do {
      printString::anon_class_64_8_a3d8de13::operator()
                ((anon_class_64_8_a3d8de13 *)local_208,(String *)uVar15);
      uVar15 = uVar15 + 0x20;
    } while (uVar15 != uVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_268);
  std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
  if (local_198 == puStack_190) {
    local_1b8._M_unused._M_object = (String *)0x0;
    local_1b8._8_8_ = (String *)0x0;
    local_1a8 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1b8,&this->m_exeName);
    local_291 = 1;
    local_268._8_8_ = (String *)0x0;
    local_268._M_unused._M_object = operator_new(0x18);
    _Var6._M_current = _Stack_220._M_current;
    _Var5._M_current = local_228._M_current;
    (((String *)local_268._M_unused._0_8_)->_M_dataplus)._M_p = (pointer)this;
    ((String *)local_268._M_unused._0_8_)->_M_string_length = (size_type)&local_291;
    (((String *)local_268._M_unused._0_8_)->field_2)._M_allocated_capacity = (size_type)&local_1b8;
    local_250 = std::
                _Function_handler<void_(Args::ArgIface_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]args-parser/samples/api/../../args-parser/help_printer.hpp:372:4)>
                ::_M_invoke;
    local_258 = std::
                _Function_handler<void_(Args::ArgIface_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]args-parser/samples/api/../../args-parser/help_printer.hpp:372:4)>
                ::_M_manager;
    std::function<void_(Args::ArgIface_*)>::function
              ((function<void_(Args::ArgIface_*)> *)&local_140,
               (function<void_(Args::ArgIface_*)> *)&local_268);
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::ArgIface*const*,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::function<void(Args::ArgIface*)>>
              ((function<void_(Args::ArgIface_*)> *)&local_100,_Var5,_Var6,
               (function<void_(Args::ArgIface_*)> *)&local_140);
    if (local_f0 != (code *)0x0) {
      (*local_f0)(&local_100,&local_100,__destroy_functor);
    }
    if (local_130 != (code *)0x0) {
      (*local_130)(&local_140,&local_140,__destroy_functor);
    }
    _Var6._M_current = _Stack_240._M_current;
    _Var5._M_current = local_248._M_current;
    local_291 = 0;
    std::function<void_(Args::ArgIface_*)>::function
              ((function<void_(Args::ArgIface_*)> *)&local_160,
               (function<void_(Args::ArgIface_*)> *)&local_268);
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::ArgIface*const*,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::function<void(Args::ArgIface*)>>
              ((function<void_(Args::ArgIface_*)> *)&local_120,_Var5,_Var6,
               (function<void_(Args::ArgIface_*)> *)&local_160);
    if (local_110 != (code *)0x0) {
      (*local_110)(&local_120,&local_120,__destroy_functor);
    }
    if (local_150 != (code *)0x0) {
      (*local_150)(&local_160,&local_160,__destroy_functor);
    }
    std::__ostream_insert<char,std::char_traits<char>>(to,"USAGE: ",7);
    pCVar1 = this->m_cmdLine;
    if ((pCVar1->m_opt & 2) != 0) {
      pvVar12 = (value_type *)c_positional_abi_cxx11_;
      if ((pCVar1->m_positionalDescription)._M_string_length != 0) {
        pvVar12 = &pCVar1->m_positionalDescription;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1b8,pvVar12);
    }
    uVar14 = 7;
    local_280 = 7;
    local_288 = 7;
    local_290 = 1;
    local_270 = 0;
    if (7 < this->m_lineLength) {
      local_270 = this->m_lineLength - 8;
    }
    uVar9 = 7;
    bVar2 = local_270 < 0x14;
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>(to,"\n\n",2);
      local_270 = this->m_lineLength - 0x14;
      uVar9 = 0;
      local_280 = 0;
      local_288 = 0x14;
      uVar14 = 0x14;
    }
    uVar4 = local_1b8._8_8_;
    local_290 = (ulong)!bVar2;
    local_271 = (OutStreamType)(uVar9 < uVar14);
    local_208 = (undefined1  [8])&local_271;
    local_210[0] = false;
    local_210[1] = false;
    local_210[2] = false;
    local_210[3] = false;
    local_210[4] = false;
    local_210[5] = false;
    local_210[6] = false;
    local_210[7] = false;
    local_1f8._M_allocated_capacity = (size_type)&local_280;
    local_1f8._8_8_ = &local_288;
    local_1e8._M_head_impl._M_data =
         (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>)local_210;
    local_1e0._M_head_impl._M_data = (reference_wrapper<unsigned_long>)&local_270;
    local_1d0._M_head_impl._M_data =
         (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
         &local_290;
    local_200 = (HelpPrinter *)to;
    local_1d8._M_head_impl._M_data =
         (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
         (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)this;
    if (local_1b8._M_unused._M_object != (void *)local_1b8._8_8_) {
      uVar15 = local_1b8._M_unused._0_8_;
      do {
        printString::anon_class_64_8_a3d8de13::operator()
                  ((anon_class_64_8_a3d8de13 *)local_208,(String *)uVar15);
        uVar15 = uVar15 + 0x20;
      } while (uVar15 != uVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
    if (local_258 != (code *)0x0) {
      (*local_258)(&local_268,&local_268,3);
    }
    this_00 = &local_1b8;
  }
  else {
    local_268._M_unused._M_object = (String *)0x0;
    local_268._8_8_ = (String *)0x0;
    local_258 = (code *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_268,&this->m_exeName);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_268,(value_type *)c_commands_abi_cxx11_);
    if ((local_248._M_current != _Stack_240._M_current) ||
       (local_228._M_current != _Stack_220._M_current)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_268,(value_type *)c_options_abi_cxx11_);
    }
    pCVar1 = this->m_cmdLine;
    if ((pCVar1->m_opt & 2) != 0) {
      pvVar12 = (value_type *)c_positional_abi_cxx11_;
      if ((pCVar1->m_positionalDescription)._M_string_length != 0) {
        pvVar12 = &pCVar1->m_positionalDescription;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_268,pvVar12);
    }
    uVar14 = 7;
    std::__ostream_insert<char,std::char_traits<char>>(to,"USAGE: ",7);
    local_1b8._M_unused._M_member_pointer = 7;
    local_280 = 7;
    local_288 = 1;
    local_290 = 0;
    if (7 < this->m_lineLength) {
      local_290 = this->m_lineLength - 8;
    }
    uVar9 = 7;
    bVar2 = local_290 < 0x14;
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>(to,"\n\n",2);
      local_290 = this->m_lineLength - 0x14;
      uVar9 = 0;
      local_1b8._M_unused._M_object = (String *)0x0;
      local_280 = 0x14;
      uVar14 = 0x14;
    }
    uVar4 = local_268._8_8_;
    local_288 = (ulong)!bVar2;
    local_210[0] = uVar9 < uVar14;
    local_270 = 0;
    local_208 = (undefined1  [8])local_210;
    local_1f8._8_8_ = &local_280;
    local_1e8._M_head_impl._M_data =
         (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>)&local_270;
    local_1e0._M_head_impl._M_data = (reference_wrapper<unsigned_long>)&local_290;
    local_1d0._M_head_impl._M_data =
         (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
         &local_288;
    local_200 = (HelpPrinter *)to;
    local_1f8._M_allocated_capacity = (size_type)&local_1b8;
    local_1d8._M_head_impl._M_data =
         (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
         (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)this;
    if (local_268._M_unused._M_object != (void *)local_268._8_8_) {
      uVar15 = local_268._M_unused._0_8_;
      do {
        printString::anon_class_64_8_a3d8de13::operator()
                  ((anon_class_64_8_a3d8de13 *)local_208,(String *)uVar15);
        uVar15 = uVar15 + 0x20;
      } while (uVar15 != uVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
    puVar7 = puStack_190;
    local_1f8._M_allocated_capacity = (size_type)&local_178;
    local_208 = (undefined1  [8])to;
    local_200 = this;
    if (local_198 != puStack_190) {
      puVar13 = local_198;
      do {
        print::anon_class_24_3_e40bd48b::operator()
                  ((anon_class_24_3_e40bd48b *)local_208,(Command *)*puVar13);
        puVar13 = puVar13 + 1;
      } while (puVar13 != puVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
    this_00 = &local_268;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
  _Var8._M_head_impl = local_168._M_head_impl;
  uVar11 = local_170 + 6;
  uVar10 = local_168._M_head_impl + 1;
  if (local_168._M_head_impl + 1 < uVar11) {
    uVar10 = uVar11;
  }
  if (local_168._M_head_impl == 1) {
    uVar10 = uVar11;
  }
  if (local_228._M_current != _Stack_220._M_current) {
    std::__ostream_insert<char,std::char_traits<char>>(to,"REQUIRED:",9);
    std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
    local_b0._M_f = (offset_in_HelpPrinter_to_subr)printOnlyFor;
    local_b0._8_8_ = 0;
    local_b0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<4UL,_unsigned_long>.
    super__Head_base<4UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<4UL,_unsigned_long,_false>)
         (_Head_base<4UL,_unsigned_long,_false>)_Var8._M_head_impl;
    local_b0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl = uVar10;
    local_b0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Head_base<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_false>
    ._M_head_impl._M_data =
         (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>)
         (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>)to;
    local_b0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .super__Head_base<0UL,_Args::HelpPrinter_*,_false>._M_head_impl = this;
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::ArgIface*const*,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::_Bind<void(Args::HelpPrinter::*(Args::HelpPrinter*,std::_Placeholder<1>,std::reference_wrapper<std::ostream>,unsigned_long,unsigned_long))(Args::ArgIface*,std::ostream&,unsigned_long,unsigned_long)const>>
              ((_Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long))(Args::ArgIface_*,_std::basic_ostream<char,_std::char_traits<char>_>_&,_unsigned_long,_unsigned_long)_const>
                *)local_208,local_228,_Stack_220,&local_b0);
  }
  if (local_248._M_current != _Stack_240._M_current) {
    std::__ostream_insert<char,std::char_traits<char>>(to,"OPTIONAL:",9);
    std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
    local_e0._M_f = (offset_in_HelpPrinter_to_subr)printOnlyFor;
    local_e0._8_8_ = 0;
    local_e0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<4UL,_unsigned_long>.
    super__Head_base<4UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<4UL,_unsigned_long,_false>)
         (_Head_base<4UL,_unsigned_long,_false>)_Var8._M_head_impl;
    local_e0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl = uVar10;
    local_e0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Head_base<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_false>
    ._M_head_impl._M_data =
         (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>)
         (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>)to;
    local_e0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .super__Head_base<0UL,_Args::HelpPrinter_*,_false>._M_head_impl = this;
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::ArgIface*const*,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::_Bind<void(Args::HelpPrinter::*(Args::HelpPrinter*,std::_Placeholder<1>,std::reference_wrapper<std::ostream>,unsigned_long,unsigned_long))(Args::ArgIface*,std::ostream&,unsigned_long,unsigned_long)const>>
              ((_Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long))(Args::ArgIface_*,_std::basic_ostream<char,_std::char_traits<char>_>_&,_unsigned_long,_unsigned_long)_const>
                *)local_208,local_248,_Stack_240,&local_e0);
  }
  std::ostream::flush();
  if (local_198 != (undefined8 *)0x0) {
    operator_delete(local_198,local_188 - (long)local_198);
  }
  if (local_248._M_current != (ArgIface **)0x0) {
    operator_delete(local_248._M_current,local_238 - (long)local_248._M_current);
  }
  if (local_228._M_current != (ArgIface **)0x0) {
    operator_delete(local_228._M_current,local_218 - (long)local_228._M_current);
  }
  return;
}

Assistant:

inline void
HelpPrinter::print( OutStreamType & to )
{
	std::vector< ArgIface* > required;
	std::vector< ArgIface* > optional;
	std::vector< Command* > commands;

	String::size_type maxFlag = 0;
	String::size_type maxName = 0;
	String::size_type maxCommand = 0;

	bool requiredAllOfGroup = false;

	auto f = std::bind( &HelpPrinter::sortArg, this, std::placeholders::_1,
		std::ref( commands ), std::ref( required ),
		std::ref( optional ), std::ref( maxFlag ),
		std::ref( maxName ), std::ref( maxCommand ),
		requiredAllOfGroup );

	std::for_each( m_cmdLine->arguments().cbegin(),
		m_cmdLine->arguments().cend(), f );

	// Sort arguments by name.
	std::sort( required.begin(), required.end(),
		[] ( const auto & a1, const auto & a2 )
			{ return details::argNameLess( a1, a2 ); } );

	std::sort( optional.begin(), optional.end(),
		[] ( const auto & a1, const auto & a2 )
			{ return details::argNameLess( a1, a2 ); } );

	std::sort( commands.begin(), commands.end(),
		[] ( const auto & c1, const auto & c2 )
			{ return details::argNameLess( c1, c2 ); } );

	maxFlag += 2;
	maxName += 2;
	maxCommand += 2;

	printString( to, splitToWords( m_appDescription ), 0, 0, 0 );

	to << "\n" << "\n";

	if( commands.empty() )
	{
		StringList usage;

		usage.push_back( m_exeName );

		bool requiredFlag = true;

		std::function< void ( ArgIface* ) > createUsageAndAppend =
			[ & ] ( ArgIface * arg )
			{
				const StringList words = createUsageString( arg,
					requiredFlag );

				for( const auto & w : details::asConst( words ) )
					usage.push_back( w );
			};

		std::for_each( required.cbegin(), required.cend(),
			createUsageAndAppend );

		requiredFlag = false;

		std::for_each( optional.cbegin(), optional.cend(),
			createUsageAndAppend );

		to << "USAGE: ";

		if( m_cmdLine->parserOptions() & CmdLine::HandlePositionalArguments )
			usage.push_back( m_cmdLine->positionalDescription().empty() ? c_positional :
				m_cmdLine->positionalDescription() );

		printString( to, usage, 7, 7, 1 );

		to << "\n" << "\n";
	}
	else
	{
		StringList usage;

		usage.push_back( m_exeName );
		usage.push_back( c_commands );

		if( !optional.empty() || !required.empty() )
			usage.push_back( c_options );

		if( m_cmdLine->parserOptions() & CmdLine::HandlePositionalArguments )
			usage.push_back( m_cmdLine->positionalDescription().empty() ? c_positional :
				m_cmdLine->positionalDescription() );

		to << "USAGE: ";

		printString( to, usage, 7, 7, 1 );

		to << "\n" << "\n";

		std::for_each( commands.cbegin(), commands.cend(),
			[ & ] ( Command * cmd )
			{
				String::size_type pos = 2;

				to << "  " << cmd->name();

				pos += cmd->name().length();

				if( cmd->isWithValue() )
				{
					to << " <" << cmd->valueSpecifier() << ">";

					pos += 3 + cmd->valueSpecifier().length();
				}

				printString( to, splitToWords( cmd->description() ), pos,
					maxCommand + 1, 0 );

				to << "\n";
			} );

		to << "\n";
	}

	auto printArg = std::bind( &HelpPrinter::printOnlyFor, this,
		std::placeholders::_1, std::ref( to ),
			( maxFlag == 1 ? maxName + 6 : ( maxName + 6 > maxFlag + 1 ?
				maxName + 6 : maxFlag + 1 ) ),
		maxFlag );

	if( !required.empty() )
	{
		to << "REQUIRED:" << "\n";

		std::for_each( required.cbegin(), required.cend(), printArg );
	}

	if( !optional.empty() )
	{
		to << "OPTIONAL:" << "\n";

		std::for_each( optional.cbegin(), optional.cend(), printArg );
	}

	to.flush();
}